

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O1

void __thiscall EmulNet::EmulNet(EmulNet *this,Params *p)

{
  long lVar1;
  long lVar2;
  int (*paiVar3) [3600];
  
  this->_vptr_EmulNet = (_func_int **)&PTR__EmulNet_0010bd00;
  (this->emulnet)._vptr_EM = (_func_int **)&PTR__EM_0010bd30;
  this->par = p;
  (this->emulnet).nextid = 1;
  (this->emulnet).currbuffsize = 0;
  this->enInited = 0;
  paiVar3 = this->recv_msgs;
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      paiVar3[-0x3e9][lVar2] = 0;
      (*paiVar3)[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xe10);
    lVar1 = lVar1 + 1;
    paiVar3 = paiVar3 + 1;
  } while (lVar1 != 1000);
  return;
}

Assistant:

EmulNet::EmulNet(Params *p)
{
	//trace.funcEntry("EmulNet::EmulNet");
	int i,j;
	par = p;
	emulnet.setNextId(1);
	emulnet.settCurrBuffSize(0);
	enInited=0;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			sent_msgs[i][j] = 0;
			recv_msgs[i][j] = 0;
		}
	}
	//trace.funcExit("EmulNet::EmulNet", SUCCESS);
}